

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptObject::ToStringTagHelper(Var thisArg,ScriptContext *scriptContext,TypeId type)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  BOOL BVar5;
  int iVar6;
  JavascriptString *pJVar7;
  RecyclableObject *thisArg_00;
  RecyclableObject *obj;
  CompoundString *pCVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  wchar16 awStack_68 [4];
  WCHAR objectStartString [9];
  anon_class_8_1_1b6df084 local_48;
  anon_class_8_1_1b6df084 buildToString;
  ScriptContext *pSStack_38;
  WCHAR objectEndString [1];
  ScriptContext *scriptContext_local;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pSStack_38 = scriptContext;
  if (type == TypeIds_Null) {
    pJVar7 = StringCache::GetObjectNullDisplay(&pJVar1->stringCache);
    return pJVar7;
  }
  if (type == TypeIds_Undefined) {
    pJVar7 = StringCache::GetObjectUndefinedDisplay(&pJVar1->stringCache);
    return pJVar7;
  }
  thisArg_00 = JavascriptOperators::ToObject(thisArg,scriptContext);
  obj = (RecyclableObject *)GetToStringTagValue(thisArg_00,pSStack_38);
  local_48.scriptContext = &stack0xffffffffffffffc8;
  if (((ulong)obj >> 0x30 == 0 && obj != (RecyclableObject *)0x0) &&
     (bVar3 = VarIsImpl<Js::JavascriptString>(obj), bVar3)) {
    pJVar7 = VarTo<Js::JavascriptString>(obj);
    builtin_memcpy(awStack_68,L"[obj",8);
    builtin_memcpy(objectStartString,L"ect ",10);
    buildToString.scriptContext._6_2_ = 0x5d;
    cVar4 = JavascriptString::GetLength(pJVar7);
    pCVar8 = CompoundString::NewWithCharCapacity
                       (cVar4 + 10,(pSStack_38->super_ScriptContextBase).javascriptLibrary);
    CompoundString::AppendChars(pCVar8,awStack_68,8);
    CompoundString::AppendChars(pCVar8,pJVar7);
    CompoundString::AppendChars(pCVar8,(char16 *)((long)&buildToString.scriptContext + 6),1);
    return (JavascriptString *)pCVar8;
  }
  bVar3 = JavascriptOperators::IsArray(thisArg_00);
  if (bVar3) {
    pJVar7 = StringCache::GetObjectArrayDisplay(&pJVar1->stringCache);
    return pJVar7;
  }
  if (type == TypeIds_Proxy) {
    bVar3 = JavascriptConversion::IsCallable(thisArg_00);
    type = bVar3 | TypeIds_Proxy;
  }
  if ((int)type < 0x1b) {
    if (type - TypeIds_FirstNumberType < 4) goto switchD_00cf05bb_caseD_26;
    if (type == TypeIds_Boolean) goto switchD_00cf05bb_caseD_25;
    if (type == TypeIds_String) goto switchD_00cf05bb_caseD_27;
switchD_00cf05bb_caseD_1c:
    BVar5 = RecyclableObject::IsExternal(thisArg_00);
    if (BVar5 == 0) {
      pCVar8 = (CompoundString *)StringCache::GetObjectDisplay(&pJVar1->stringCache);
    }
    else {
      iVar6 = (*(thisArg_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x46])(thisArg_00,pSStack_38);
      pCVar8 = ToStringTagHelper::anon_class_8_1_1b6df084::operator()
                         (&local_48,(Var)CONCAT44(extraout_var,iVar6));
    }
  }
  else {
    switch(type) {
    case TypeIds_Function:
      pCVar8 = (CompoundString *)StringCache::GetObjectFunctionDisplay(&pJVar1->stringCache);
      break;
    default:
      goto switchD_00cf05bb_caseD_1c;
    case TypeIds_Date:
      pCVar8 = (CompoundString *)StringCache::GetObjectDateDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_RegEx:
      pCVar8 = (CompoundString *)StringCache::GetObjectRegExpDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_Error:
      pCVar8 = (CompoundString *)StringCache::GetObjectErrorDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_BooleanObject:
switchD_00cf05bb_caseD_25:
      pCVar8 = (CompoundString *)StringCache::GetObjectBooleanDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_NumberObject:
switchD_00cf05bb_caseD_26:
      pCVar8 = (CompoundString *)StringCache::GetObjectNumberDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_StringObject:
switchD_00cf05bb_caseD_27:
      pCVar8 = (CompoundString *)StringCache::GetObjectStringDisplay(&pJVar1->stringCache);
      break;
    case TypeIds_Arguments:
      pCVar8 = (CompoundString *)StringCache::GetObjectArgumentsDisplay(&pJVar1->stringCache);
    }
  }
  if (pCVar8 == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x246,"(builtInTag != nullptr)","builtInTag != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  return (JavascriptString *)pCVar8;
}

Assistant:

JavascriptString* JavascriptObject::ToStringTagHelper(Var thisArg, ScriptContext *scriptContext, TypeId type)
{
    JavascriptLibrary *library = scriptContext->GetLibrary();

    // 1. If the this value is undefined, return "[object Undefined]".
    if (type == TypeIds_Undefined)
    {
        return library->GetObjectUndefinedDisplayString();
    }
    // 2. If the this value is null, return "[object Null]".
    if (type == TypeIds_Null)
    {
        return library->GetObjectNullDisplayString();
    }

    // 3. Let O be ToObject(this value).
    RecyclableObject *thisArgAsObject = JavascriptOperators::ToObject(thisArg, scriptContext);

    // 15. Let tag be ? Get(O, @@toStringTag).
    Var tag = JavascriptObject::GetToStringTagValue(thisArgAsObject, scriptContext);

    // 17. Return the String that is the result of concatenating "[object ", tag, and "]".
    auto buildToString = [&scriptContext](Var tag) {
        JavascriptString *tagStr = VarTo<JavascriptString>(tag);
        const WCHAR objectStartString[9] = _u("[object ");
        const WCHAR objectEndString[1] = { _u(']') };
        CompoundString *const cs = CompoundString::NewWithCharCapacity(_countof(objectStartString)
            + _countof(objectEndString) + tagStr->GetLength(), scriptContext->GetLibrary());

        cs->AppendChars(objectStartString, _countof(objectStartString) - 1 /* ditch \0 */);
        cs->AppendChars(tagStr);
        cs->AppendChars(objectEndString, _countof(objectEndString));

        return cs;
    };
    if (tag != nullptr && VarIs<JavascriptString>(tag))
    {
        return buildToString(tag);
    }

    // 4. Let isArray be ? IsArray(O).
    // There is an implicit check for a null proxy handler in IsArray, so use the operator.
    BOOL isArray = JavascriptOperators::IsArray(thisArgAsObject);

    // If we don't have a tag or it's not a string, use the 'built in tag'.
    if (isArray)
    {
        // 5. If isArray is true, let builtinTag be "Array".
        return library->GetObjectArrayDisplayString();
    }

        // callable proxy is considered as having [[Call]] internal method and should match #8 below
        if (type == TypeIds_Proxy && JavascriptConversion::IsCallable(thisArgAsObject))
        {
            type = TypeIds_Function;
        }

    JavascriptString* builtInTag = nullptr;
    switch (type)
    {
        // 6. Else if O is an exotic String object, let builtinTag be "String".
    case TypeIds_String:
    case TypeIds_StringObject:
        builtInTag = library->GetObjectStringDisplayString();
        break;

        // 7. Else if O has an[[ParameterMap]] internal slot, let builtinTag be "Arguments".
    case TypeIds_Arguments:
        builtInTag = library->GetObjectArgumentsDisplayString();
        break;

        // 8. Else if O has a [[Call]] internal method, let builtinTag be "Function".
    case TypeIds_Function:
        builtInTag = library->GetObjectFunctionDisplayString();
        break;

        // 9. Else if O has an [[ErrorData]] internal slot, let builtinTag be "Error".
    case TypeIds_Error:
        builtInTag = library->GetObjectErrorDisplayString();
        break;

        // 10. Else if O has a [[BooleanData]] internal slot, let builtinTag be "Boolean".
    case TypeIds_Boolean:
    case TypeIds_BooleanObject:
        builtInTag = library->GetObjectBooleanDisplayString();
        break;

        // 11. Else if O has a [[NumberData]] internal slot, let builtinTag be "Number".
    case TypeIds_Number:
    case TypeIds_Int64Number:
    case TypeIds_UInt64Number:
    case TypeIds_Integer:
    case TypeIds_NumberObject:
        builtInTag = library->GetObjectNumberDisplayString();
        break;

        // 12. Else if O has a [[DateValue]] internal slot, let builtinTag be "Date".
    case TypeIds_Date:
        builtInTag = library->GetObjectDateDisplayString();
        break;

        // 13. Else if O has a [[RegExpMatcher]] internal slot, let builtinTag be "RegExp".
    case TypeIds_RegEx:
        builtInTag = library->GetObjectRegExpDisplayString();
        break;

        // 14. Else, let builtinTag be "Object".
    default:
    {
        if (thisArgAsObject->IsExternal())
        {
            builtInTag = buildToString(thisArgAsObject->GetClassName(scriptContext));
        }
        else
        {
            builtInTag = library->GetObjectDisplayString(); // [object Object]
        }
        break;
    }
    }

    Assert(builtInTag != nullptr);

    return builtInTag;
}